

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_set_mfcfh(acmod_t *acmod,FILE *logfh)

{
  int local_1c;
  FILE *pFStack_18;
  int rv;
  FILE *logfh_local;
  acmod_t *acmod_local;
  
  local_1c = 0;
  pFStack_18 = logfh;
  logfh_local = (FILE *)acmod;
  if (acmod->mfcfh != (FILE *)0x0) {
    fclose((FILE *)acmod->mfcfh);
  }
  logfh_local->_lock = pFStack_18;
  fwrite(&local_1c,4,1,(FILE *)logfh_local->_lock);
  return local_1c;
}

Assistant:

int
acmod_set_mfcfh(acmod_t *acmod, FILE *logfh)
{
    int rv = 0;

    if (acmod->mfcfh)
        fclose(acmod->mfcfh);
    acmod->mfcfh = logfh;
    fwrite(&rv, 4, 1, acmod->mfcfh);
    return rv;
}